

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressionValidator.cpp
# Opt level: O0

Result * CoreML::validateSchemaTypesIsMultiArray
                   (Result *__return_storage_ptr__,FeatureDescription *featureDesc,
                   ArrayFeatureType_ArrayDataType allowedArrayFeatureDataType,int shapeSizeMin,
                   int shapeSizeMax)

{
  bool bVar1;
  TypeCase TVar2;
  MLFeatureTypeType x;
  ArrayFeatureType_ArrayDataType AVar3;
  MLArrayDataType x_00;
  ostream *poVar4;
  FeatureType *this;
  char *pcVar5;
  string *psVar6;
  ArrayFeatureType *pAVar7;
  string local_580;
  stringstream local_560 [8];
  stringstream out_2;
  ostream local_550 [380];
  int local_3d4;
  undefined1 local_3d0 [4];
  int shapeSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  stringstream local_390 [8];
  stringstream out_1;
  ostream local_380 [376];
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  stringstream local_1b8 [8];
  stringstream out;
  ostream local_1a8 [376];
  FeatureType *local_30;
  FeatureType *type;
  int local_20;
  int shapeSizeMax_local;
  int shapeSizeMin_local;
  ArrayFeatureType_ArrayDataType allowedArrayFeatureDataType_local;
  FeatureDescription *featureDesc_local;
  
  type._4_4_ = shapeSizeMax;
  local_20 = shapeSizeMin;
  shapeSizeMax_local = allowedArrayFeatureDataType;
  _shapeSizeMin_local = featureDesc;
  featureDesc_local = (FeatureDescription *)__return_storage_ptr__;
  local_30 = Specification::FeatureDescription::type(featureDesc);
  bVar1 = Specification::FeatureType::has_multiarraytype(local_30);
  if ((bVar1) && (TVar2 = Specification::FeatureType::Type_case(local_30), TVar2 == kMultiArrayType)
     ) {
    pAVar7 = Specification::FeatureType::multiarraytype(local_30);
    AVar3 = Specification::ArrayFeatureType::datatype(pAVar7);
    if (AVar3 == shapeSizeMax_local) {
      pAVar7 = Specification::FeatureType::multiarraytype(local_30);
      local_3d4 = Specification::ArrayFeatureType::shape_size(pAVar7);
      if ((local_3d4 < local_20) || (type._4_4_ < local_3d4)) {
        std::__cxx11::stringstream::stringstream(local_560);
        poVar4 = std::operator<<(local_550,"Unsupported array rank ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3d4);
        poVar4 = std::operator<<(poVar4," should be in range [");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,type._4_4_);
        poVar4 = std::operator<<(poVar4,"]");
        poVar4 = std::operator<<(poVar4,".");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::stringstream::str();
        Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_580);
        std::__cxx11::string::~string((string *)&local_580);
        std::__cxx11::stringstream::~stringstream(local_560);
      }
      else {
        Result::Result(__return_storage_ptr__);
      }
    }
    else {
      std::__cxx11::stringstream::stringstream(local_390);
      poVar4 = std::operator<<(local_380,"Unsupported array type \"");
      pAVar7 = Specification::FeatureType::multiarraytype(local_30);
      x_00 = Specification::ArrayFeatureType::datatype(pAVar7);
      pcVar5 = MLArrayDataType_Name(x_00);
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4,"\" for feature \"");
      psVar6 = Specification::FeatureDescription::name_abi_cxx11_(_shapeSizeMin_local);
      std::operator+(&local_3b0,psVar6,"\". ");
      poVar4 = std::operator<<(poVar4,(string *)&local_3b0);
      poVar4 = std::operator<<(poVar4,"Should be of: ");
      pcVar5 = MLArrayDataType_Name(shapeSizeMax_local);
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4,".");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::stringstream::str();
      Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                     (string *)local_3d0);
      std::__cxx11::string::~string((string *)local_3d0);
      std::__cxx11::stringstream::~stringstream(local_390);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar4 = std::operator<<(local_1a8,"Unsupported type \"");
    this = Specification::FeatureDescription::type(_shapeSizeMin_local);
    x = Specification::FeatureType::Type_case(this);
    pcVar5 = ::MLFeatureTypeType_Name(x);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\" for feature \"");
    psVar6 = Specification::FeatureDescription::name_abi_cxx11_(_shapeSizeMin_local);
    std::operator+(&local_1e8,psVar6,"\". ");
    poVar4 = std::operator<<(poVar4,(string *)&local_1e8);
    poVar4 = std::operator<<(poVar4,"Should be of: ");
    pcVar5 = ::MLFeatureTypeType_Name(MLFeatureTypeType_multiArrayType);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," with data type of: ");
    pcVar5 = MLArrayDataType_Name(shapeSizeMax_local);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,".");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::stringstream::str();
    Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateSchemaTypesIsMultiArray(const Specification::FeatureDescription& featureDesc,
                                           Specification::ArrayFeatureType_ArrayDataType allowedArrayFeatureDataType,
                                           int shapeSizeMin = 1,
                                           int shapeSizeMax = INT_MAX) {
        // Check the types
        auto& type = featureDesc.type();
        if (!type.has_multiarraytype() || type.Type_case() != Specification::FeatureType::kMultiArrayType) {
            // Invalid type
            std::stringstream out;
            out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(featureDesc.type().Type_case()))
            << "\" for feature \"" << featureDesc.name() + "\". "
            << "Should be of: " << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::FeatureType::kMultiArrayType))
            << " with data type of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(allowedArrayFeatureDataType))
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        if (type.multiarraytype().datatype() != allowedArrayFeatureDataType) {
            std::stringstream out;
            out << "Unsupported array type \"" << MLArrayDataType_Name(static_cast<MLArrayDataType>(type.multiarraytype().datatype()))
            << "\" for feature \"" << featureDesc.name() + "\". "
            << "Should be of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(allowedArrayFeatureDataType))
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        int shapeSize = type.multiarraytype().shape_size();
        if (shapeSize<shapeSizeMin || shapeSizeMax < shapeSize) {
            std::stringstream out;
            out << "Unsupported array rank " << shapeSize
            << " should be in range [" << shapeSizeMin << "," << shapeSizeMax << "]"
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        // no invariant broken -- type matches one of the allowed types
        return Result();
    }